

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_type sVar5;
  size_type sVar6;
  TokenType TVar7;
  undefined4 uVar8;
  reference pvVar9;
  Token TStack_58;
  
  if ((this->tokens_).size_ == 0) {
    WastLexer::GetToken(&TStack_58,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&TStack_58);
  }
  pvVar9 = CircularArray<wabt::Token,_2UL>::front(&this->tokens_);
  sVar1 = (pvVar9->loc).filename.size_;
  sVar2 = (pvVar9->loc).field_1.field_1.offset;
  uVar3 = *(undefined8 *)((long)&(pvVar9->loc).field_1 + 8);
  TVar7 = pvVar9->token_type_;
  uVar8 = *(undefined4 *)&pvVar9->field_0x24;
  pcVar4 = (pvVar9->field_2).text_.data_;
  sVar5 = (pvVar9->field_2).text_.size_;
  sVar6 = (pvVar9->field_2).literal_.text.size_;
  (__return_storage_ptr__->loc).filename.data_ = (pvVar9->loc).filename.data_;
  (__return_storage_ptr__->loc).filename.size_ = sVar1;
  (__return_storage_ptr__->loc).field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar3;
  __return_storage_ptr__->token_type_ = TVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar8;
  (__return_storage_ptr__->field_2).text_.data_ = pcVar4;
  (__return_storage_ptr__->field_2).text_.size_ = sVar5;
  (__return_storage_ptr__->field_2).literal_.text.size_ = sVar6;
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}